

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRVariable * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::allocate<unsigned_int&,spv::StorageClass>
          (ObjectPool<spirv_cross::SPIRVariable> *this,uint *p,StorageClass *p_1)

{
  uint uVar1;
  StorageClass storage_;
  SPIRVariable *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRVariable **ppSVar4;
  VariableID local_5c;
  ID local_58;
  TypeID local_54;
  SPIRVariable *local_50;
  SPIRVariable *ptr;
  uint local_3c;
  SPIRVariable *pSStack_38;
  uint i;
  SPIRVariable *ptr_1;
  StorageClass *pSStack_28;
  uint num_objects;
  StorageClass *p_local_1;
  uint *p_local;
  ObjectPool<spirv_cross::SPIRVariable> *this_local;
  
  pSStack_28 = p_1;
  p_local_1 = p;
  p_local = (uint *)this;
  bVar2 = VectorView<spirv_cross::SPIRVariable_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_38 = (SPIRVariable *)malloc((ulong)ptr_1._4_4_ * 0xb0);
    if (pSStack_38 == (SPIRVariable *)0x0) {
      return (SPIRVariable *)0x0;
    }
    for (local_3c = 0; local_3c < ptr_1._4_4_; local_3c = local_3c + 1) {
      ptr = pSStack_38 + local_3c;
      SmallVector<spirv_cross::SPIRVariable_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRVariable*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffc8);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRVariable_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>);
  local_50 = *ppSVar4;
  SmallVector<spirv_cross::SPIRVariable_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_50;
  TypedID<(spirv_cross::Types)1>::TypedID(&local_54,*p_local_1);
  storage_ = *pSStack_28;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_58,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&local_5c,0);
  SPIRVariable::SPIRVariable(this_00,local_54,storage_,local_58,local_5c);
  return local_50;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}